

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

void Abc_TtCofactorTest10(word *pTruth,int nVars,int N)

{
  ulong *puVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  word wVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  word *pwVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  int iVar;
  uint *pLimitU;
  word *pwVar13;
  word *pwVar14;
  ulong uVar15;
  ulong uVar16;
  
  if (1 < nVars) {
    uVar6 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar6 = 1;
    }
    lVar2 = (ulong)uVar6 * 8;
    uVar16 = 0;
    do {
      if (0 < (int)uVar6) {
        lVar8 = 0;
        do {
          *(undefined8 *)((long)Abc_TtCofactorTest10::pCopy1 + lVar8) =
               *(undefined8 *)((long)pTruth + lVar8);
          lVar8 = lVar8 + 8;
        } while (lVar2 - lVar8 != 0);
      }
      iVar = (int)uVar16;
      if (uVar16 < 5) {
        if (0 < (int)uVar6) {
          uVar10 = s_PMasks[uVar16][0];
          uVar15 = s_PMasks[uVar16][1];
          uVar3 = s_PMasks[uVar16][2];
          lVar8 = 0;
          do {
            uVar4 = *(ulong *)((long)Abc_TtCofactorTest10::pCopy1 + lVar8);
            bVar11 = (byte)(1 << ((byte)uVar16 & 0x1f));
            *(ulong *)((long)Abc_TtCofactorTest10::pCopy1 + lVar8) =
                 (uVar4 & uVar3) >> (bVar11 & 0x3f) |
                 (uVar4 & uVar15) << (bVar11 & 0x3f) | uVar4 & uVar10;
            lVar8 = lVar8 + 8;
          } while (lVar2 - lVar8 != 0);
          goto LAB_004f5246;
        }
      }
      else if (uVar16 == 5) {
        if (0 < (int)uVar6) {
          pwVar9 = Abc_TtCofactorTest10::pCopy1;
          do {
            puVar1 = (ulong *)((long)pwVar9 + 4);
            *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
            pwVar9 = pwVar9 + 2;
          } while (pwVar9 < Abc_TtCofactorTest10::pCopy1 + (int)uVar6);
LAB_004f5246:
          if (0 < (int)uVar6) {
            lVar8 = 0;
            do {
              *(undefined8 *)((long)Abc_TtCofactorTest10::pCopy2 + lVar8) =
                   *(undefined8 *)((long)pTruth + lVar8);
              lVar8 = lVar8 + 8;
            } while (lVar2 - lVar8 != 0);
          }
        }
      }
      else if (0 < (int)uVar6) {
        uVar10 = (ulong)(uint)(1 << ((byte)uVar16 - 6 & 0x1f));
        if (uVar16 < 7) {
          uVar10 = 1;
        }
        iVar7 = (int)uVar10;
        iVar12 = iVar7 * 4;
        pwVar13 = Abc_TtCofactorTest10::pCopy1 + (uint)(iVar7 * 2);
        pwVar14 = Abc_TtCofactorTest10::pCopy1 + uVar10;
        pwVar9 = Abc_TtCofactorTest10::pCopy1;
        do {
          if (0 < iVar7) {
            uVar15 = 0;
            do {
              wVar5 = pwVar14[uVar15];
              pwVar14[uVar15] = pwVar13[uVar15];
              pwVar13[uVar15] = wVar5;
              uVar15 = uVar15 + 1;
            } while (uVar10 != uVar15);
          }
          pwVar9 = pwVar9 + iVar12;
          pwVar13 = pwVar13 + iVar12;
          pwVar14 = pwVar14 + iVar12;
        } while (pwVar9 < Abc_TtCofactorTest10::pCopy1 + (int)uVar6);
        goto LAB_004f5246;
      }
      uVar16 = uVar16 + 1;
      Abc_TtSwapVars(Abc_TtCofactorTest10::pCopy2,nVars,iVar,(int)uVar16);
      if (0 < (int)uVar6) {
        lVar8 = 0;
        do {
          if (*(long *)((long)Abc_TtCofactorTest10::pCopy1 + lVar8) !=
              *(long *)((long)Abc_TtCofactorTest10::pCopy2 + lVar8)) {
            __assert_fail("Abc_TtEqual( pCopy1, pCopy2, nWords )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                          ,0x2d0,"void Abc_TtCofactorTest10(word *, int, int)");
          }
          lVar8 = lVar8 + 8;
        } while (lVar2 - lVar8 != 0);
      }
    } while (uVar16 != nVars - 1);
  }
  return;
}

Assistant:

void Abc_TtCofactorTest10( word * pTruth, int nVars, int N )
{
    static word pCopy1[1024];
    static word pCopy2[1024];
    int nWords = Abc_TtWordNum( nVars );
    int i;
    for ( i = 0; i < nVars - 1; i++ )
    {
//        Kit_DsdPrintFromTruth( pTruth, nVars ); printf( "\n" );
        Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
        Abc_TtSwapAdjacent( pCopy1, nWords, i );
//        Kit_DsdPrintFromTruth( pCopy1, nVars ); printf( "\n" );
        Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
        Abc_TtSwapVars( pCopy2, nVars, i, i+1 );
//        Kit_DsdPrintFromTruth( pCopy2, nVars ); printf( "\n" );
        assert( Abc_TtEqual( pCopy1, pCopy2, nWords ) );
    }
}